

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.h
# Opt level: O3

string * __thiscall
xLearn::CrossEntropyLoss::loss_type_abi_cxx11_
          (string *__return_storage_ptr__,CrossEntropyLoss *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"log_loss","");
  return __return_storage_ptr__;
}

Assistant:

std::string loss_type() { return "log_loss"; }